

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_sod(opj_j2k_t *j2k)

{
  int iVar1;
  opj_cio_t *cio;
  uint uVar2;
  int iVar3;
  int iVar4;
  opj_codestream_info_t *poVar5;
  uchar *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  cio = j2k->cio;
  iVar1 = j2k->curtileno;
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    iVar3 = cio_tell(cio);
    poVar5 = j2k->cstr_info;
    iVar4 = j2k->cur_tp_num;
    poVar5->tile[j2k->curtileno].tp[iVar4].tp_end_header = j2k->pos_correction + iVar3 + -1;
    if ((long)iVar4 == 0) {
      iVar4 = cio_tell(cio);
      poVar5 = j2k->cstr_info;
      poVar5->tile[j2k->curtileno].end_header = j2k->pos_correction + iVar4 + -1;
    }
    poVar5->packno = 0;
  }
  iVar4 = *(int *)&j2k->eot;
  puVar6 = cio_getbp(cio);
  uVar7 = iVar4 - (int)puVar6;
  iVar4 = cio_numbytesleft(cio);
  uVar2 = iVar4 + 1U;
  if ((int)uVar7 < (int)(iVar4 + 1U)) {
    uVar2 = uVar7;
  }
  iVar3 = cio_numbytesleft(cio);
  puVar6 = (uchar *)realloc(j2k->tile_data[iVar1],(long)j2k->tile_len[iVar1] + (long)(int)uVar2);
  iVar4 = j2k->tile_len[iVar1];
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    uVar7 = cio_read(cio,1);
    puVar6[uVar9 + (long)iVar4] = (uchar)uVar7;
  }
  j2k->tile_len[iVar1] = j2k->tile_len[iVar1] + uVar2;
  j2k->tile_data[iVar1] = puVar6;
  iVar1 = 8;
  if (uVar2 == iVar3 + 1U) {
    iVar1 = 0x40;
  }
  j2k->state = iVar1;
  j2k->cur_tp_num = j2k->cur_tp_num + 1;
  return;
}

Assistant:

static void j2k_read_sod(opj_j2k_t *j2k) {
	int len, truncate = 0, i;
	unsigned char *data = NULL, *data_ptr = NULL;

	opj_cio_t *cio = j2k->cio;
	int curtileno = j2k->curtileno;

	/* Index */
	if (j2k->cstr_info) {
		j2k->cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
			cio_tell(cio) + j2k->pos_correction - 1;
		if (j2k->cur_tp_num == 0)
			j2k->cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
		j2k->cstr_info->packno = 0;
	}
	
	len = int_min(j2k->eot - cio_getbp(cio), cio_numbytesleft(cio) + 1);

	if (len == cio_numbytesleft(cio) + 1) {
		truncate = 1;		/* Case of a truncate codestream */
	}	

	data = j2k->tile_data[curtileno];
	data = (unsigned char*) opj_realloc(data, (j2k->tile_len[curtileno] + len) * sizeof(unsigned char));

	data_ptr = data + j2k->tile_len[curtileno];
	for (i = 0; i < len; i++) {
		data_ptr[i] = cio_read(cio, 1);
	}

	j2k->tile_len[curtileno] += len;
	j2k->tile_data[curtileno] = data;
	
	if (!truncate) {
		j2k->state = J2K_STATE_TPHSOT;
	} else {
		j2k->state = J2K_STATE_NEOC;	/* RAJOUTE !! */
	}
	j2k->cur_tp_num++;
}